

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::objectivec::ParseSimpleFile
               (string *path,LineConsumer *line_consumer,string *out_error)

{
  _Alloc_hider _Var1;
  string *this;
  bool bVar2;
  int file_descriptor;
  int *piVar3;
  char *__rhs;
  int i;
  allocator local_20d;
  int buf_len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  StringPiece local_1b8;
  string local_1a8;
  string *local_188;
  void *buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  StringPiece local_98;
  FileInputStream file_stream;
  
  while (file_descriptor = open((path->_M_dataplus)._M_p,0), file_descriptor < 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 4) {
      std::__cxx11::string::string
                ((string *)&local_208,"error: Unable to open \"",(allocator *)&local_158);
      std::operator+(&local_178,&local_208,path);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &file_stream,&local_178,"\", ");
      __rhs = strerror(*piVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &file_stream,__rhs);
      std::__cxx11::string::operator=((string *)out_error,(string *)local_1e8);
      std::__cxx11::string::~string((string *)local_1e8);
      std::__cxx11::string::~string((string *)&file_stream);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_208);
      return false;
    }
  }
  local_188 = out_error;
  io::FileInputStream::FileInputStream(&file_stream,file_descriptor,-1);
  local_1e8._8_4_ = 0;
  local_1d8._M_allocated_capacity = (size_type)&local_1c8;
  local_1d8._8_8_ = 0;
  file_stream.copying_input_.close_on_delete_ = true;
  local_1c8._M_local_buf[0] = '\0';
  local_1b8.ptr_ = (char *)0x0;
  local_1b8.length_ = 0;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_local_buf[0] = '\0';
  local_1e8._0_8_ = line_consumer;
  do {
    do {
      bVar2 = io::FileInputStream::Next(&file_stream,&buf,&buf_len);
      if (!bVar2) {
        if (local_1a8._M_string_length == 0) {
          bVar2 = true;
        }
        else {
          std::__cxx11::string::append((char *)&local_1a8);
          _Var1._M_p = local_1a8._M_dataplus._M_p;
          local_1b8.length_ = StringPiece::CheckedSsizeTFromSizeT(local_1a8._M_string_length);
          local_1b8.ptr_ = _Var1._M_p;
          bVar2 = anon_unknown_0::Parser::ParseLoop((Parser *)local_1e8);
          if (!bVar2) goto LAB_002618fc;
          bVar2 = local_1b8.length_ == 0;
        }
        goto LAB_00261902;
      }
    } while ((long)buf_len == 0);
    StringPiece::StringPiece(&local_98,(char *)buf,(long)buf_len);
    local_208._M_dataplus._M_p = local_98.ptr_;
    local_208._M_string_length = local_98.length_;
    if (local_1a8._M_string_length == 0) {
      local_1b8.ptr_ = local_98.ptr_;
      local_1b8.length_ = local_98.length_;
    }
    else {
      StringPiece::AppendToString((StringPiece *)&local_208,&local_1a8);
      _Var1._M_p = local_1a8._M_dataplus._M_p;
      local_1b8.length_ = StringPiece::CheckedSsizeTFromSizeT(local_1a8._M_string_length);
      local_1b8.ptr_ = _Var1._M_p;
    }
    bVar2 = anon_unknown_0::Parser::ParseLoop((Parser *)local_1e8);
    if (local_1b8.length_ == 0) {
      local_1a8._M_string_length = 0;
      *local_1a8._M_dataplus._M_p = '\0';
    }
    else {
      StringPiece::ToString_abi_cxx11_(&local_178,&local_1b8);
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
    }
  } while (bVar2);
  std::__cxx11::string::string((string *)&local_f8,"error: ",&local_20d);
  std::operator+(&local_d8,&local_f8,path);
  this = local_188;
  std::operator+(&local_b8,&local_d8," Line ");
  SimpleItoa_abi_cxx11_(&local_118,(protobuf *)(ulong)(uint)local_1e8._8_4_,i);
  std::operator+(&local_158,&local_b8,&local_118);
  std::operator+(&local_208,&local_158,", ");
  std::__cxx11::string::string((string *)&local_138,(string *)(local_1e8 + 0x10));
  std::operator+(&local_178,&local_208,&local_138);
  std::__cxx11::string::operator=((string *)this,(string *)&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
LAB_002618fc:
  bVar2 = false;
LAB_00261902:
  anon_unknown_0::Parser::~Parser((Parser *)local_1e8);
  io::FileInputStream::~FileInputStream(&file_stream);
  return bVar2;
}

Assistant:

bool ParseSimpleFile(
    const string& path, LineConsumer* line_consumer, string* out_error) {
  int fd;
  do {
    fd = open(path.c_str(), O_RDONLY);
  } while (fd < 0 && errno == EINTR);
  if (fd < 0) {
    *out_error =
        string("error: Unable to open \"") + path + "\", " + strerror(errno);
    return false;
  }
  io::FileInputStream file_stream(fd);
  file_stream.SetCloseOnDelete(true);

  Parser parser(line_consumer);
  const void* buf;
  int buf_len;
  while (file_stream.Next(&buf, &buf_len)) {
    if (buf_len == 0) {
      continue;
    }

    if (!parser.ParseChunk(StringPiece(static_cast<const char*>(buf), buf_len))) {
      *out_error =
          string("error: ") + path +
          " Line " + SimpleItoa(parser.last_line()) + ", " + parser.error_str();
      return false;
    }
  }
  return parser.Finish();
}